

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datamanager.cpp
# Opt level: O1

int DataManager::getLinkValue(int index,int param,double *value,Network *nw)

{
  int iVar1;
  Link *link;
  char *__to;
  double dVar2;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  undefined4 extraout_var;
  
  *value = 0.0;
  if (index < 0) {
    return 0xcd;
  }
  iVar1 = Network::count(nw,LINK);
  if (iVar1 <= index) {
    return 0xcd;
  }
  iVar1 = Network::link(nw,(char *)(ulong)(uint)index,__to);
  link = (Link *)CONCAT44(extraout_var,iVar1);
  switch(param) {
  case 0:
    dVar2 = link->diameter * (nw->units).factors[0];
    break;
  default:
    iVar1 = getPipeValue(param,link,value,nw);
    return iVar1;
  case 3:
    dVar2 = link->lossCoeff;
    break;
  case 4:
    dVar2 = (double)link->initStatus;
    break;
  case 5:
    dVar2 = link->initSetting;
    break;
  case 8:
    dVar2 = link->flow;
    goto LAB_0012190a;
  case 9:
    (*(link->super_Element)._vptr_Element[0xd])(link);
    dVar2 = extraout_XMM0_Qa;
    goto LAB_00121925;
  case 10:
    dVar2 = link->hLoss;
LAB_00121925:
    dVar2 = dVar2 * (nw->units).factors[1];
    break;
  case 0xb:
    dVar2 = (double)link->status;
    break;
  case 0xc:
    (*(link->super_Element)._vptr_Element[0x11])(link,nw);
    dVar2 = extraout_XMM0_Qa_00;
    break;
  case 0xd:
    goto switchD_001218d2_caseD_d;
  case 0xe:
    dVar2 = link->quality * (nw->units).factors[8];
    break;
  case 0x11:
    dVar2 = link->leakage;
LAB_0012190a:
    dVar2 = dVar2 * (nw->units).factors[5];
  }
  *value = dVar2;
switchD_001218d2_caseD_d:
  return 0;
}

Assistant:

int DataManager::getLinkValue(int index, int param, double* value, Network* nw)
{
    *value = 0.0;
    if ( index < 0 || index >= nw->count(Element::LINK) ) return 205;
    Link* link = nw->link(index);
    switch (param)
    {
    case EN_DIAMETER:
        *value = link->diameter * nw->ucf(Units::DIAMETER);
        break;
     case EN_MINORLOSS:
         *value = link->lossCoeff;
         break;
     case EN_INITSTATUS:
        *value = link->initStatus;
        break;
    case EN_INITSETTING:
        *value = link->initSetting;
        break;
    case EN_FLOW:
        *value = link->flow * nw->ucf(Units::FLOW);
        break;
    case EN_VELOCITY:
        *value = link->getVelocity() * nw->ucf(Units::LENGTH);
        break;
    case EN_HEADLOSS:
        *value = link->hLoss * nw->ucf(Units::LENGTH);
        break;
    case EN_STATUS:
        *value = link->status;
        break;
    case EN_SETTING:
        *value = link->getSetting(nw);
        break;
    case EN_ENERGY:
        break;                         // TO BE ADDED
    case EN_LINKQUAL:
        *value = link->quality * nw->ucf(Units::CONCEN);
        break;
    case EN_LEAKAGE:
        *value = link->leakage * nw->ucf(Units::FLOW);
        break;
    default: return getPipeValue(param, link, value, nw);
    }
    return 0;
}